

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O2

void __thiscall
llvm::DWARFDebugNames::NameIndex::dumpAbbreviations(NameIndex *this,ScopedPrinter *W)

{
  uint uVar1;
  DenseSetPair<llvm::DWARFDebugNames::Abbrev> *pDVar2;
  DenseSet<llvm::DWARFDebugNames::Abbrev,_llvm::DWARFDebugNames::AbbrevMapInfo> *__range1;
  StringRef N;
  undefined1 local_40 [8];
  const_iterator __begin1;
  ListScope AbbrevsScope;
  
  N.Length = 0xd;
  N.Data = "Abbreviations";
  DelimitedScope<'[',_']'>::DelimitedScope((DelimitedScope<_[_,__]_> *)&__begin1.I.End,W,N);
  _local_40 = DenseMapBase<llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>
              ::begin((DenseMapBase<llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>
                       *)this);
  uVar1 = (this->Abbrevs).
          super_DenseSetImpl<llvm::DWARFDebugNames::Abbrev,_llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::AbbrevMapInfo>
          .TheMap.NumBuckets;
  pDVar2 = (this->Abbrevs).
           super_DenseSetImpl<llvm::DWARFDebugNames::Abbrev,_llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::AbbrevMapInfo>
           .TheMap.Buckets;
  while (local_40 != (undefined1  [8])&pDVar2[uVar1].key) {
    Abbrev::dump((Abbrev *)local_40,W);
    DenseMapIterator<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>,_true>
    ::operator++((DenseMapIterator<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>,_true>
                  *)local_40);
  }
  DelimitedScope<'[',_']'>::~DelimitedScope((DelimitedScope<_[_,__]_> *)&__begin1.I.End);
  return;
}

Assistant:

void DWARFDebugNames::NameIndex::dumpAbbreviations(ScopedPrinter &W) const {
  ListScope AbbrevsScope(W, "Abbreviations");
  for (const auto &Abbr : Abbrevs)
    Abbr.dump(W);
}